

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O2

void bloaty::pe::AddCatchAll(PeFile *pe,RangeSink *sink)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  
  if (pe->ok_ != false) {
    name._M_str = "[PE Headers]";
    name._M_len = 0xc;
    RangeSink::AddRange(sink,"pe_catchall",name,
                        (long)(pe->pe_headers_)._M_str - (long)(sink->file_->data_)._M_str,
                        (pe->pe_headers_)._M_len,pe->pe_headers_);
    name_00._M_str = "[PE Section Headers]";
    name_00._M_len = 0x14;
    RangeSink::AddRange(sink,"pe_catchall",name_00,
                        (long)(pe->section_headers_)._M_str - (long)(sink->file_->data_)._M_str,
                        (pe->section_headers_)._M_len,pe->section_headers_);
    name_01._M_str = "[Unmapped]";
    name_01._M_len = 10;
    RangeSink::AddFileRange(sink,"pe_catchall",name_01,sink->file_->data_);
    return;
  }
  __assert_fail("pe.IsOpen()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/pe.cc",0xcc,
                "void bloaty::pe::AddCatchAll(const PeFile &, RangeSink *)");
}

Assistant:

void AddCatchAll(const PeFile& pe, RangeSink* sink) {
  assert(pe.IsOpen());

  auto begin = pe.pe_headers().data() - sink->input_file().data().data();
  sink->AddRange("pe_catchall", "[PE Headers]", begin, pe.pe_headers().size(),
                 pe.pe_headers());

  begin = pe.section_headers().data() - sink->input_file().data().data();
  sink->AddRange("pe_catchall", "[PE Section Headers]", begin,
                 pe.section_headers().size(), pe.section_headers());

  // The last-line fallback to make sure we cover the entire file.
  sink->AddFileRange("pe_catchall", "[Unmapped]", sink->input_file().data());
}